

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_mul op;
  int local_344;
  int local_2d8;
  undefined8 *local_2c8;
  float *local_2c0;
  undefined8 *local_2b8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined4 uStack_a4;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined4 uStack_64;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  
  local_2c8 = in_RDX;
  local_2c0 = in_RSI;
  local_2b8 = in_RDI;
  if (in_R8D == 8) {
    for (local_2d8 = 0; local_2d8 < in_ECX; local_2d8 = local_2d8 + 1) {
      fVar1 = *local_2c0;
      auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      local_c0 = (float)*local_2b8;
      fStack_bc = (float)((ulong)*local_2b8 >> 0x20);
      fStack_b8 = (float)local_2b8[1];
      fStack_b4 = (float)((ulong)local_2b8[1] >> 0x20);
      fStack_b0 = (float)local_2b8[2];
      fStack_ac = (float)((ulong)local_2b8[2] >> 0x20);
      fStack_a8 = (float)local_2b8[3];
      uStack_a4 = (undefined4)((ulong)local_2b8[3] >> 0x20);
      local_e0 = auVar4._0_4_;
      fStack_dc = auVar4._4_4_;
      fStack_d8 = auVar4._8_4_;
      fStack_d4 = auVar4._12_4_;
      fStack_d0 = auVar3._0_4_;
      fStack_cc = auVar3._4_4_;
      fStack_c8 = auVar3._8_4_;
      *local_2c8 = CONCAT44(fStack_bc * fStack_dc,local_c0 * local_e0);
      local_2c8[1] = CONCAT44(fStack_b4 * fStack_d4,fStack_b8 * fStack_d8);
      local_2c8[2] = CONCAT44(fStack_ac * fStack_cc,fStack_b0 * fStack_d0);
      local_2c8[3] = CONCAT44(uStack_a4,fStack_a8 * fStack_c8);
      local_2b8 = local_2b8 + 4;
      local_2c0 = local_2c0 + 1;
      local_2c8 = local_2c8 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_344 = 0; local_344 + 1 < in_ECX; local_344 = local_344 + 2) {
      fVar1 = *local_2c0;
      fVar2 = local_2c0[1];
      local_80 = (float)*local_2b8;
      fStack_7c = (float)((ulong)*local_2b8 >> 0x20);
      fStack_78 = (float)local_2b8[1];
      fStack_74 = (float)((ulong)local_2b8[1] >> 0x20);
      fStack_70 = (float)local_2b8[2];
      fStack_6c = (float)((ulong)local_2b8[2] >> 0x20);
      fStack_68 = (float)local_2b8[3];
      uStack_64 = (undefined4)((ulong)local_2b8[3] >> 0x20);
      *local_2c8 = CONCAT44(fStack_7c * fVar1,local_80 * fVar1);
      local_2c8[1] = CONCAT44(fStack_74 * fVar1,fStack_78 * fVar1);
      local_2c8[2] = CONCAT44(fStack_6c * fVar2,fStack_70 * fVar2);
      local_2c8[3] = CONCAT44(uStack_64,fStack_68 * fVar2);
      local_2b8 = local_2b8 + 4;
      local_2c0 = local_2c0 + 2;
      local_2c8 = local_2c8 + 4;
    }
    for (; local_344 < in_ECX; local_344 = local_344 + 1) {
      fVar1 = *local_2c0;
      local_40 = (float)*local_2b8;
      fStack_3c = (float)((ulong)*local_2b8 >> 0x20);
      fStack_38 = (float)local_2b8[1];
      fStack_34 = (float)((ulong)local_2b8[1] >> 0x20);
      *local_2c8 = CONCAT44(fStack_3c * fVar1,local_40 * fVar1);
      local_2c8[1] = CONCAT44(fStack_34 * fVar1,fStack_38 * fVar1);
      local_2b8 = local_2b8 + 2;
      local_2c0 = local_2c0 + 1;
      local_2c8 = local_2c8 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}